

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

StringTree * __thiscall
capnp::anon_unknown_2::Indent::delimit
          (StringTree *__return_storage_ptr__,Indent *this,Array<kj::StringTree> *items,
          PrintMode mode,PrintKind kind)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  PrintKind PVar4;
  undefined4 in_register_00000084;
  StringTree *item;
  StringTree *pSVar5;
  long lVar6;
  ulong uVar7;
  StringPtr delim;
  StringPtr delim_00;
  undefined1 local_e1;
  Array<kj::StringTree> *local_e0;
  PrintMode local_d4;
  StringTree *local_d0;
  Array<char> delimArrayPtr_heap;
  char *local_a0;
  StringTree local_98;
  char delimArrayPtr_stack [32];
  
  local_e0 = items;
  local_d4 = mode;
  local_d0 = __return_storage_ptr__;
  if (this->amount != 0) {
    pSVar5 = items->ptr;
    uVar7 = 0;
    PVar4 = kind;
    for (lVar6 = items->size_ * 0x38; lVar6 != 0; lVar6 = lVar6 + -0x38) {
      if (0x18 < pSVar5->size_) {
LAB_0043dc11:
        uVar1 = this->amount * 2 + 3;
        if (uVar1 < 0x21) {
          delimArrayPtr_heap.ptr = (char *)0x0;
          delimArrayPtr_heap.size_ = 0;
          delimArrayPtr_heap.disposer = (ArrayDisposer *)0x0;
          pcVar3 = delimArrayPtr_stack;
        }
        else {
          pcVar3 = kj::_::HeapArrayDisposer::allocate<char>((ulong)uVar1);
          delimArrayPtr_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          delimArrayPtr_heap.ptr = pcVar3;
          delimArrayPtr_heap.size_ = (ulong)uVar1;
        }
        pcVar3[0] = ',';
        pcVar3[1] = '\n';
        memset(pcVar3 + 2,0x20,(ulong)(this->amount * 2));
        local_a0 = " ";
        if (local_d4 != BARE) {
          local_a0 = pcVar3 + 1;
        }
        pcVar3[this->amount * 2 + 2] = '\0';
        delim_00.content.size_._0_4_ = this->amount * 2 + 3;
        delim_00.content.ptr = pcVar3;
        delim_00.content.size_._4_4_ = 0;
        kj::StringTree::StringTree(&local_98,local_e0,delim_00);
        pSVar5 = local_d0;
        local_e1 = 0x20;
        kj::strTree<char_const*,kj::StringTree,char>
                  (local_d0,(kj *)&local_a0,(char **)&local_98,
                   (StringTree *)&stack0xffffffffffffff1f,
                   (char *)CONCAT44(in_register_00000084,PVar4));
        kj::StringTree::~StringTree(&local_98);
        kj::Array<char>::~Array(&delimArrayPtr_heap);
        return pSVar5;
      }
      kj::StringTree::flattenTo(pSVar5,(char *)&local_98);
      sVar2 = pSVar5->size_;
      *(undefined1 *)((long)&local_98.size_ + sVar2) = 0;
      pcVar3 = strchr((char *)&local_98,10);
      if ((pcVar3 != (char *)0x0) || ((kind == RECORD && (uVar7 = uVar7 + sVar2, 0x40 < uVar7))))
      goto LAB_0043dc11;
      pSVar5 = pSVar5 + 1;
    }
  }
  pSVar5 = local_d0;
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree(local_d0,local_e0,delim);
  return pSVar5;
}

Assistant:

kj::StringTree delimit(kj::Array<kj::StringTree> items, PrintMode mode, PrintKind kind) {
    if (amount == 0 || canPrintAllInline(items, kind)) {
      return kj::StringTree(kj::mv(items), ", ");
    } else {
      KJ_STACK_ARRAY(char, delimArrayPtr, amount * 2 + 3, 32, 256);
      auto delim = delimArrayPtr.begin();
      delim[0] = ',';
      delim[1] = '\n';
      memset(delim + 2, ' ', amount * 2);
      delim[amount * 2 + 2] = '\0';

      // If the outer value isn't being printed on its own line, we need to add a newline/indent
      // before the first item, otherwise we only add a space on the assumption that it is preceded
      // by an open bracket or parenthesis.
      return kj::strTree(mode == BARE ? " " : delim + 1,
          kj::StringTree(kj::mv(items), kj::StringPtr(delim, amount * 2 + 2)), ' ');
    }
  }